

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
 __thiscall spvtools::opt::analysis::MatrixConstant::CopyMatrixConstant(MatrixConstant *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  Matrix *local_18;
  
  local_18 = (Matrix *)(**(code **)(**(long **)(in_RSI + 8) + 0x80))();
  MakeUnique<spvtools::opt::analysis::MatrixConstant,spvtools::opt::analysis::Matrix_const*>
            ((spvtools *)this,&local_18);
  pp_Var1 = (this->super_CompositeConstant).super_Constant._vptr_Constant;
  std::
  vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,void>
            ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
              *)(pp_Var1 + 2),(const_iterator)pp_Var1[3],
             (__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              )*(Constant ***)(in_RSI + 0x10),
             (__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              )*(Constant ***)(in_RSI + 0x18));
  return (__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<MatrixConstant> CopyMatrixConstant() const {
    auto another = MakeUnique<MatrixConstant>(type_->AsMatrix());
    another->components_.insert(another->components_.end(), components_.begin(),
                                components_.end());
    return another;
  }